

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileDescriptor *pFVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  LogMessage *other;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  LogFinisher local_231;
  pthread_mutex_t *local_230;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  StringPiece local_208;
  StringPiece local_1f8;
  string filename;
  string module_name;
  Printer printer;
  FileDescriptorProto fdp;
  ZeroCopyOutputStream *output;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = (pthread_mutex_t *)error;
  ParseGeneratorParameter(parameter,&options);
  bVar4 = true;
  uVar7 = 0xffffffffffffffff;
  lVar2 = -0x40;
  do {
    lVar8 = lVar2;
    uVar7 = uVar7 + 1;
    if ((ulong)((long)options.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)options.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar7) {
      std::mutex::lock(&(this->mutex_).mu_);
      this->file_ = file;
      local_230 = (pthread_mutex_t *)&this->mutex_;
      anon_unknown_0::ModuleName(&module_name,*(string **)file);
      std::__cxx11::string::string((string *)&filename,(string *)&module_name);
      ReplaceCharacters(&filename,".",'/');
      std::__cxx11::string::append((char *)&filename);
      this->pure_python_workable_ = bVar4;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_1f8,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
      stringpiece_internal::StringPiece::StringPiece(&local_208,"google/protobuf/");
      bVar4 = HasPrefixString(local_1f8,local_208);
      if (bVar4) {
        this->pure_python_workable_ = true;
      }
      FileDescriptorProto::FileDescriptorProto(&fdp);
      FileDescriptor::CopyTo(this->file_,&fdp);
      MessageLite::SerializeToString((MessageLite *)&fdp,&this->file_descriptor_serialized_);
      iVar5 = (*context->_vptr_GeneratorContext[2])(context,&filename);
      output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
      if (output == (ZeroCopyOutputStream *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&printer,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
                   ,0x157);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)&printer,"CHECK failed: output.get(): ");
        internal::LogFinisher::operator=(&local_231,other);
        internal::LogMessage::~LogMessage((LogMessage *)&printer);
      }
      io::Printer::Printer(&printer,output,'$');
      this->printer_ = &printer;
      pFVar1 = this->file_;
      GeneratingDescriptorProto(this);
      io::Printer::Print<char[9],std::__cxx11::string>
                (&printer,
                 "# -*- coding: utf-8 -*-\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\"\"\"Generated protocol buffer code.\"\"\"\n"
                 ,(char (*) [9])"filename",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar1);
      if (0 < *(int *)(pFVar1 + 0x30)) {
        io::Printer::Print<>(&printer,"from google.protobuf.internal import enum_type_wrapper\n");
      }
      io::Printer::Print<>
                (&printer,
                 "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import descriptor_pool as _descriptor_pool\nfrom google.protobuf import message as _message\nfrom google.protobuf import reflection as _reflection\nfrom google.protobuf import symbol_database as _symbol_database\n"
                );
      if ((0 < *(int *)(pFVar1 + 0x34)) && (*(char *)(*(long *)(pFVar1 + 0x78) + 0x9d) == '\x01')) {
        io::Printer::Print<>
                  (&printer,
                   "from google.protobuf import service as _service\nfrom google.protobuf import service_reflection\n"
                  );
      }
      io::Printer::Print<>
                (&printer,
                 "# @@protoc_insertion_point(imports)\n\n_sym_db = _symbol_database.Default()\n");
      io::Printer::Print<>(&printer,"\n\n");
      if (this->pure_python_workable_ == true) {
        PrintImports(this);
      }
      PrintFileDescriptor(this);
      PrintTopLevelEnums(this);
      PrintTopLevelExtensions(this);
      if (this->pure_python_workable_ == true) {
        bVar4 = GeneratingDescriptorProto(this);
        if (bVar4) {
          io::Printer::Print<>(this->printer_,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
          io::Printer::Indent(this->printer_);
          PrintAllNestedEnumsInFile(this,kCreate);
          PrintMessageDescriptors(this,kCreate);
          FixForeignFieldsInDescriptors(this);
          io::Printer::Outdent(this->printer_);
          io::Printer::Print<>(this->printer_,"else:\n");
          io::Printer::Indent(this->printer_);
        }
        PrintMessageDescriptors(this,kFind);
        PrintAllNestedEnumsInFile(this,kFind);
        bVar4 = GeneratingDescriptorProto(this);
        if (bVar4) {
          io::Printer::Outdent(this->printer_);
        }
      }
      PrintMessages(this);
      if (this->pure_python_workable_ == true) {
        PrintServiceDescriptors(this);
        io::Printer::Print<>(&printer,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
        io::Printer::Indent(this->printer_);
        FixForeignFieldsInExtensions(this);
        FixAllDescriptorOptions(this);
        SetSerializedPbInterval(this);
        io::Printer::Outdent(this->printer_);
      }
      if ((0 < *(int *)(file + 0x34)) && (*(char *)(*(long *)(file + 0x78) + 0x9d) == '\x01')) {
        PrintServices(this);
      }
      io::Printer::Print<>(&printer,"# @@protoc_insertion_point(module_scope)\n");
      io::Printer::~Printer(&printer);
      if (output != (ZeroCopyOutputStream *)0x0) {
        (*output->_vptr_ZeroCopyOutputStream[1])(output);
      }
      bVar6 = printer.failed_ ^ 1;
      FileDescriptorProto::~FileDescriptorProto(&fdp);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&module_name);
      pthread_mutex_unlock(local_230);
      goto LAB_002c06d1;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&options.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].first._M_dataplus.
                                    _M_p + lVar8),"cpp_generated_lib_linked");
    bVar4 = false;
    lVar2 = lVar8 + 0x40;
  } while (bVar3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fdp,
                 "Unknown generator option: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&options.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].first._M_dataplus._M_p + lVar8
                 ));
  std::__cxx11::string::operator=((string *)&local_230->__data,(string *)&fdp);
  std::__cxx11::string::~string((string *)&fdp);
  bVar6 = 0;
LAB_002c06d1:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  return (bool)bVar6;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const std::string& parameter,
                         GeneratorContext* context, std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options
  bool cpp_generated_lib_linked = false;

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "cpp_generated_lib_linked") {
      cpp_generated_lib_linked = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  std::string module_name = ModuleName(file->name());
  std::string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  pure_python_workable_ = !cpp_generated_lib_linked;
  if (HasPrefixString(file->name(), "google/protobuf/")) {
    pure_python_workable_ = true;
  }

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  if (pure_python_workable_) {
    PrintImports();
  }
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  if (pure_python_workable_) {
    if (GeneratingDescriptorProto()) {
      printer_->Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
      printer_->Indent();
      // Create enums before message descriptors
      PrintAllNestedEnumsInFile(StripPrintDescriptor::kCreate);
      PrintMessageDescriptors(StripPrintDescriptor::kCreate);
      FixForeignFieldsInDescriptors();
      printer_->Outdent();
      printer_->Print("else:\n");
      printer_->Indent();
    }
    // Find the message descriptors first and then use the message
    // descriptor to find enums.
    PrintMessageDescriptors(StripPrintDescriptor::kFind);
    PrintAllNestedEnumsInFile(StripPrintDescriptor::kFind);
    if (GeneratingDescriptorProto()) {
      printer_->Outdent();
    }
  }
  PrintMessages();
  if (pure_python_workable_) {
    PrintServiceDescriptors();

    printer.Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
    printer_->Indent();

    // We have to fix up the extensions after the message classes themselves,
    // since they need to call static RegisterExtension() methods on these
    // classes.
    FixForeignFieldsInExtensions();
    // Descriptor options may have custom extensions. These custom options
    // can only be successfully parsed after we register corresponding
    // extensions. Therefore we parse all options again here to recognize
    // custom options that may be unknown when we define the descriptors.
    // This does not apply to services because they are not used by extensions.
    FixAllDescriptorOptions();

    // Set serialized_start and serialized_end.
    SetSerializedPbInterval();

    printer_->Outdent();
  }
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print("# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}